

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O1

AggregateFunctionSet * duckdb::StringAggFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  long lVar1;
  undefined8 *puVar2;
  AggregateFunctionSet *in_RDI;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  AggregateFunction string_agg_param;
  allocator_type local_421;
  LogicalType local_420;
  LogicalType local_408;
  LogicalType local_3f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  undefined1 local_3c0 [144];
  LogicalType LStack_330;
  FunctionStability local_318;
  FunctionNullHandling FStack_317;
  FunctionErrors FStack_316;
  FunctionCollationHandling FStack_315;
  undefined8 auStack_310 [11];
  code *local_2b8;
  code *local_2b0;
  AggregateOrderDependent local_2a8;
  AggregateDistinctDependent AStack_2a7;
  element_type *local_2a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  bVar4 = 0;
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_408,VARCHAR);
  LogicalType::ANY_PARAMS(&local_3f0,&local_408,5);
  __l._M_len = 1;
  __l._M_array = &local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d8,__l,&local_421);
  LogicalType::LogicalType(&local_420,VARCHAR);
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_3c0,(vector<duckdb::LogicalType,_true> *)&local_3d8,
             &local_420,AggregateFunction::StateSize<duckdb::StringAggState>,
             AggregateFunction::
             StateInitialize<duckdb::StringAggState,duckdb::StringAggFunction,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             AggregateFunction::StateCombine<duckdb::StringAggState,duckdb::StringAggFunction>,
             AggregateFunction::
             StateFinalize<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             AggregateFunction::
             UnaryUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             StringAggBind,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_420);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  LogicalType::~LogicalType(&local_3f0);
  LogicalType::~LogicalType(&local_408);
  local_2b8 = StringAggSerialize;
  local_2b0 = StringAggDeserialize;
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_290,(SimpleFunction *)local_3c0);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::LogicalType(&local_290.super_BaseScalarFunction.return_type,&LStack_330);
  local_290.super_BaseScalarFunction.stability = local_318;
  local_290.super_BaseScalarFunction.null_handling = FStack_317;
  local_290.super_BaseScalarFunction.errors = FStack_316;
  local_290.super_BaseScalarFunction.collation_handling = FStack_315;
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  puVar2 = auStack_310;
  pp_Var3 = &local_290.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_290.order_dependent = local_2a8;
  local_290.distinct_dependent = AStack_2a7;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2a0;
  local_290.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_290);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_290.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3c0 + 0x48),
             &LogicalType::VARCHAR);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_160,(SimpleFunction *)local_3c0);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::LogicalType(&local_160.super_BaseScalarFunction.return_type,&LStack_330);
  local_160.super_BaseScalarFunction.stability = local_318;
  local_160.super_BaseScalarFunction.null_handling = FStack_317;
  local_160.super_BaseScalarFunction.errors = FStack_316;
  local_160.super_BaseScalarFunction.collation_handling = FStack_315;
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  puVar2 = auStack_310;
  pp_Var3 = &local_160.state_size;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pp_Var3 = (aggregate_size_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar4 * -2 + 1;
  }
  local_160.order_dependent = local_2a8;
  local_160.distinct_dependent = AStack_2a7;
  local_160.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2a0;
  local_160.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_160);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_160.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
  local_3c0._0_8_ = &PTR__AggregateFunction_02477a08;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3c0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet StringAggFun::GetFunctions() {
	AggregateFunctionSet string_agg;
	AggregateFunction string_agg_param(
	    {LogicalType::ANY_PARAMS(LogicalType::VARCHAR)}, LogicalType::VARCHAR,
	    AggregateFunction::StateSize<StringAggState>,
	    AggregateFunction::StateInitialize<StringAggState, StringAggFunction>,
	    AggregateFunction::UnaryScatterUpdate<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::StateCombine<StringAggState, StringAggFunction>,
	    AggregateFunction::StateFinalize<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::UnaryUpdate<StringAggState, string_t, StringAggFunction>, StringAggBind);
	string_agg_param.serialize = StringAggSerialize;
	string_agg_param.deserialize = StringAggDeserialize;
	string_agg.AddFunction(string_agg_param);
	string_agg_param.arguments.emplace_back(LogicalType::VARCHAR);
	string_agg.AddFunction(string_agg_param);
	return string_agg;
}